

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

void __thiscall cmFileCopier::NotBeforeMatch(cmFileCopier *this,string *arg)

{
  cmExecutionStatus *pcVar1;
  ostream *poVar2;
  ostringstream e;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,"option ");
  poVar2 = std::operator<<(poVar2,(string *)arg);
  std::operator<<(poVar2," may not appear before PATTERN or REGEX.");
  pcVar1 = this->Status;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
  std::__cxx11::string::~string(local_1b0);
  this->Doing = 1;
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void cmFileCopier::NotBeforeMatch(std::string const& arg)
{
  std::ostringstream e;
  e << "option " << arg << " may not appear before PATTERN or REGEX.";
  this->Status.SetError(e.str());
  this->Doing = DoingError;
}